

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

int canvas_path_iterate(_glist *x,t_canvas_path_iterator fun,void *user_data)

{
  char *__src;
  char *__src_00;
  int iVar1;
  int iVar2;
  t_symbol *ptVar3;
  size_t sVar4;
  char *local_458;
  char local_438 [8];
  char realname [1000];
  char *dir;
  t_namelist *ptStack_38;
  int count;
  t_namelist *nl;
  _glist *y;
  void *user_data_local;
  t_canvas_path_iterator fun_local;
  _glist *x_local;
  
  dir._4_4_ = 0;
  nl = (t_namelist *)x;
  if (fun == (t_canvas_path_iterator)0x0) {
    x_local._4_4_ = 0;
  }
  else {
    for (; nl != (t_namelist *)0x0; nl = (t_namelist *)nl[4].nl_string) {
      if (nl[0xe].nl_next != (_namelist *)0x0) {
        ptVar3 = canvas_getdir((_glist *)nl);
        __src = ptVar3->s_name;
        for (ptStack_38 = nl[0xe].nl_next[2].nl_next; ptStack_38 != (_namelist *)0x0;
            ptStack_38 = ptStack_38->nl_next) {
          iVar1 = sys_isabsolutepath(ptStack_38->nl_string);
          if (iVar1 == 0) {
            strncpy(local_438,__src,1000);
            realname[0x3dd] = '\0';
            strcat(local_438,"/");
          }
          else {
            local_438[0] = '\0';
          }
          __src_00 = ptStack_38->nl_string;
          sVar4 = strlen(local_438);
          strncat(local_438,__src_00,1000 - sVar4);
          realname[0x3df] = '\0';
          iVar1 = (*fun)(local_438,user_data);
          if (iVar1 == 0) {
            return dir._4_4_ + 1;
          }
          dir._4_4_ = dir._4_4_ + 1;
        }
      }
    }
    if (x == (_glist *)0x0) {
      local_458 = ".";
    }
    else {
      ptVar3 = canvas_getdir(x);
      local_458 = ptVar3->s_name;
    }
    iVar1 = (*fun)(local_458,user_data);
    if (iVar1 == 0) {
      x_local._4_4_ = dir._4_4_ + 1;
    }
    else {
      iVar1 = dir._4_4_;
      for (ptStack_38 = (pd_maininstance.pd_stuff)->st_searchpath; dir._4_4_ = iVar1 + 1,
          ptStack_38 != (t_namelist *)0x0; ptStack_38 = ptStack_38->nl_next) {
        iVar2 = (*fun)(ptStack_38->nl_string,user_data);
        if (iVar2 == 0) {
          return iVar1 + 2;
        }
        iVar1 = dir._4_4_;
      }
      for (ptStack_38 = (pd_maininstance.pd_stuff)->st_temppath; ptStack_38 != (t_namelist *)0x0;
          ptStack_38 = ptStack_38->nl_next) {
        iVar1 = (*fun)(ptStack_38->nl_string,user_data);
        if (iVar1 == 0) {
          return dir._4_4_ + 1;
        }
        dir._4_4_ = dir._4_4_ + 1;
      }
      if (sys_usestdpath != 0) {
        for (ptStack_38 = (pd_maininstance.pd_stuff)->st_staticpath; ptStack_38 != (t_namelist *)0x0
            ; ptStack_38 = ptStack_38->nl_next) {
          iVar1 = (*fun)(ptStack_38->nl_string,user_data);
          if (iVar1 == 0) {
            return dir._4_4_ + 1;
          }
          dir._4_4_ = dir._4_4_ + 1;
        }
      }
      x_local._4_4_ = dir._4_4_;
    }
  }
  return x_local._4_4_;
}

Assistant:

int canvas_path_iterate(const t_canvas *x, t_canvas_path_iterator fun,
    void *user_data)
{
    const t_canvas *y = 0;
    t_namelist *nl = 0;
    int count = 0;
    if (!fun)
        return 0;
        /* iterate through canvas-local paths */
    for (y = x; y; y = y->gl_owner)
        if (y->gl_env)
    {
        const char *dir;
        dir = canvas_getdir(y)->s_name;
        for (nl = y->gl_env->ce_path; nl; nl = nl->nl_next)
        {
            char realname[MAXPDSTRING];
            if (sys_isabsolutepath(nl->nl_string))
                realname[0] = '\0';
            else
            {   /* if not absolute path, append Pd lib dir */
                strncpy(realname, dir, MAXPDSTRING);
                realname[MAXPDSTRING-3] = 0;
                strcat(realname, "/");
            }
            strncat(realname, nl->nl_string, MAXPDSTRING-strlen(realname));
            realname[MAXPDSTRING-1] = 0;
            if (!fun(realname, user_data))
                return count+1;
            count++;
        }
    }
    /* try canvas dir */
    if (!fun((x ? canvas_getdir(x)->s_name : "."), user_data))
        return count+1;
    count++;

    /* now iterate through the global paths */
    for (nl = STUFF->st_searchpath; nl; nl = nl->nl_next)
    {
        if (!fun(nl->nl_string, user_data))
            return count+1;
        count++;
    }
    /* and the temp paths from the commandline */
    for (nl = STUFF->st_temppath; nl; nl = nl->nl_next)
    {
        if (!fun(nl->nl_string, user_data))
            return count+1;
        count++;
    }
    /* and the default paths */
    if (sys_usestdpath)
        for (nl = STUFF->st_staticpath; nl; nl = nl->nl_next)
        {
            if (!fun(nl->nl_string, user_data))
                return count+1;
            count++;
        }

    return count;
}